

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::String::String(String *this,char *in,uint in_size)

{
  char *__dest;
  
  if (in_size < 0x18) {
    memcpy(this,in,(ulong)in_size);
    (this->field_0).buf[in_size] = '\0';
    (this->field_0).buf[0x17] = '\x17' - (char)in_size;
  }
  else {
    (this->field_0).buf[0x17] = -0x80;
    (this->field_0).data.size = in_size;
    (this->field_0).data.capacity = in_size + 1;
    __dest = (char *)operator_new__((ulong)(in_size + 1));
    (this->field_0).data.ptr = __dest;
    memcpy(__dest,in,(ulong)in_size);
    __dest[in_size] = '\0';
  }
  return;
}

Assistant:

String::String(const char* in, unsigned in_size) {
    using namespace std;
    if(in_size <= last) {
        memcpy(buf, in, in_size);
        buf[in_size] = '\0';
        setLast(last - in_size);
    } else {
        setOnHeap();
        data.size     = in_size;
        data.capacity = data.size + 1;
        data.ptr      = new char[data.capacity];
        memcpy(data.ptr, in, in_size);
        data.ptr[in_size] = '\0';
    }
}